

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall string_string_utf16_Test::TestBody(string_string_utf16_Test *this)

{
  char *pcVar1;
  pointer *__ptr;
  AssertHelper local_e8;
  AssertHelper local_e0;
  AssertionResult gtest_ar_3;
  string empty;
  char16_t empty_data [1];
  utf16_buffer to_utf16;
  utf32_buffer unicode;
  string from_utf16;
  
  ST::string::from_utf16
            (&from_utf16,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  to_utf16.m_chars = (char16_t *)&DAT_0000001c;
  empty.m_buffer.m_chars = (char *)from_utf16.m_buffer.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&unicode,"text_size(utf8_test_data)","from_utf16.size()",
             (unsigned_long *)&to_utf16,(unsigned_long *)&empty);
  if ((char)unicode.m_chars == '\0') {
    testing::Message::Message((Message *)&to_utf16);
    if (unicode.m_size == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)unicode.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x12f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty,(Message *)&to_utf16);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty);
    if (to_utf16.m_chars != (char16_t *)0x0) {
      (**(code **)(*(long *)to_utf16.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&unicode.m_size);
  ST::string::to_utf32(&unicode,&from_utf16);
  empty.m_buffer.m_chars = (char *)((ulong)empty.m_buffer.m_chars & 0xffffffff00000000);
  gtest_ar_3._0_4_ =
       T_strcmp<char32_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
                          (char32_t *)CONCAT71(unicode.m_chars._1_7_,(char)unicode.m_chars));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&to_utf16,"0","T_strcmp(test_data, unicode.data())",(int *)&empty,
             (int *)&gtest_ar_3);
  if ((char)to_utf16.m_chars == '\0') {
    testing::Message::Message((Message *)&empty);
    if (to_utf16.m_size == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)to_utf16.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x131,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&empty);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (empty.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)empty.m_buffer.m_chars + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&to_utf16.m_size);
  ST::string::from_utf32
            (&empty,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  ST::string::to_utf16(&to_utf16,&empty);
  ST::buffer<char>::~buffer(&empty.m_buffer);
  gtest_ar_3.success_ = false;
  gtest_ar_3._1_3_ = 0;
  local_e8.data_._0_4_ =
       T_strcmp<char16_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",to_utf16.m_chars);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&empty,"0","T_strcmp(utf16_test_data, to_utf16.data())",(int *)&gtest_ar_3,
             (int *)&local_e8);
  if ((char)empty.m_buffer.m_chars == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (empty.m_buffer.m_size == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)empty.m_buffer.m_size;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x135,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_3._4_4_,gtest_ar_3._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&empty.m_buffer.m_size);
  empty_data[0] = L'\0';
  ST::string::from_utf16(&empty,empty_data,0xffffffffffffffff,check_validity);
  local_e0.data_._0_4_ = 0;
  local_e8.data_ = (AssertHelperData *)empty.m_buffer.m_size;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_3,"0U","empty.size()",(uint *)&local_e0,
             (unsigned_long *)&local_e8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  local_e8.data_ = local_e8.data_ & 0xffffffff00000000;
  pcVar1 = "";
  local_e0.data_._0_4_ = T_strcmp<char>(empty.m_buffer.m_chars,"");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_3,"0","T_strcmp(empty.c_str(), \"\")",(int *)&local_e8,
             (int *)&local_e0);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  ST::buffer<char>::~buffer(&empty.m_buffer);
  ST::buffer<char16_t>::~buffer(&to_utf16);
  ST::buffer<char32_t>::~buffer(&unicode);
  ST::buffer<char>::~buffer(&from_utf16.m_buffer);
  return;
}

Assistant:

TEST(string, string_utf16)
{
    // From UTF-16 to ST::string
    ST::string from_utf16 = ST::string::from_utf16(utf16_test_data);
    EXPECT_EQ(text_size(utf8_test_data), from_utf16.size());
    ST::utf32_buffer unicode = from_utf16.to_utf32();
    EXPECT_EQ(0, T_strcmp(test_data, unicode.data()));

    // From ST::string to UTF-16
    ST::utf16_buffer to_utf16 = ST::string::from_utf32(test_data).to_utf16();
    EXPECT_EQ(0, T_strcmp(utf16_test_data, to_utf16.data()));

    // Empty string
    const char16_t empty_data[] = { 0 };
    ST::string empty = ST::string::from_utf16(empty_data);
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));
}